

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  stbi_uc *psVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  stbi_uc *psVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  byte bVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  stbi_uc *psVar26;
  uint uVar27;
  byte *pbVar28;
  uint uVar29;
  int iVar30;
  stbi_uc *psVar31;
  byte *pbVar32;
  int iVar33;
  uint uVar34;
  bool bVar35;
  int local_dc;
  ulong local_68;
  ulong uVar19;
  
  bVar35 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar35;
  a_00 = a->s->img_n;
  uVar29 = a_00 << bVar35;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                  ,0x1139,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  local_dc = 0;
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar5 = a_00 * x;
      uVar18 = uVar5 * depth + 7 >> 3;
      uVar19 = (ulong)uVar18;
      if (raw_len < (uVar18 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else if (y == 0) {
joined_r0x0011343e:
        local_dc = 1;
        if (depth == 0x10) {
LAB_00113440:
          if (uVar2 * y == 0) {
LAB_00113851:
            local_dc = 1;
          }
          else {
            local_dc = 1;
            psVar6 = a->out;
            lVar10 = 0;
            do {
              puVar1 = (ushort *)(psVar6 + lVar10 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar10 = lVar10 + 1;
            } while (uVar2 * y != (int)lVar10);
          }
        }
      }
      else {
        bVar17 = *raw;
        if (bVar17 < 5) {
          lVar10 = (long)a_00;
          lVar21 = (long)(out_n << bVar35);
          iVar4 = x - 1;
          uVar7 = (ulong)y;
          psVar6 = a->out;
          lVar22 = -lVar21;
          lVar15 = -(ulong)uVar3;
          uVar16 = 0;
          lVar23 = 0;
          local_68 = (ulong)x;
          do {
            if (depth < 8) {
              if (x < uVar18) {
                __assert_fail("img_width_bytes <= x",
                              "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                              ,0x114f,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              psVar6 = psVar6 + (uVar2 - uVar18);
              uVar29 = 1;
              local_68 = uVar19;
            }
            if (lVar23 == 0) {
              bVar17 = ""[bVar17];
            }
            if (0 < (int)uVar29) {
              uVar25 = 0;
              do {
                switch(bVar17) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar8 = raw[uVar25 + 1];
                  goto LAB_00112e2a;
                case 2:
                case 4:
                  bVar8 = psVar6[uVar25 + lVar15];
                  break;
                case 3:
                  bVar8 = psVar6[uVar25 + lVar15] >> 1;
                  break;
                default:
                  goto switchD_00112e12_default;
                }
                bVar8 = bVar8 + raw[uVar25 + 1];
LAB_00112e2a:
                psVar6[uVar25] = bVar8;
switchD_00112e12_default:
                uVar25 = uVar25 + 1;
              } while (uVar29 != uVar25);
            }
            if (depth == 8) {
              lVar24 = (long)out_n;
              lVar11 = lVar10;
              if (a_00 != out_n) {
                psVar6[lVar10] = 0xff;
              }
LAB_00112e8a:
              raw = raw + lVar11 + 1;
            }
            else {
              if (depth == 0x10) {
                lVar11 = (long)(int)uVar29;
                lVar24 = lVar21;
                if (a_00 != out_n) {
                  psVar6[lVar11] = 0xff;
                  psVar6[lVar11 + 1] = 0xff;
                }
                goto LAB_00112e8a;
              }
              raw = raw + 2;
              lVar24 = 1;
            }
            psVar31 = psVar6 + lVar24;
            if (depth < 8 || a_00 == out_n) {
              uVar9 = ((int)local_68 + -1) * uVar29;
              switch(bVar17) {
              case 0:
                memcpy(psVar31,raw,(long)(int)uVar9);
                break;
              case 1:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar31[uVar16] = psVar6[uVar16 + (lVar24 - (int)uVar29)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 2:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar31[uVar16] = psVar31[uVar16 + lVar15] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 3:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar31[uVar16] =
                         (char)((uint)psVar6[uVar16 + (lVar24 - (int)uVar29)] +
                                (uint)psVar31[uVar16 + lVar15] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 4:
                if (0 < (int)uVar9) {
                  pbVar32 = psVar6 + (lVar24 - (int)uVar29);
                  uVar16 = 0;
                  do {
                    bVar17 = *pbVar32;
                    bVar8 = psVar31[lVar15];
                    bVar20 = pbVar32[lVar15];
                    iVar33 = ((uint)bVar8 + (uint)bVar17) - (uint)bVar20;
                    uVar27 = iVar33 - (uint)bVar17;
                    uVar14 = -uVar27;
                    if (0 < (int)uVar27) {
                      uVar14 = uVar27;
                    }
                    uVar13 = iVar33 - (uint)bVar8;
                    uVar27 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar27 = uVar13;
                    }
                    uVar34 = iVar33 - (uint)bVar20;
                    uVar13 = -uVar34;
                    if (0 < (int)uVar34) {
                      uVar13 = uVar34;
                    }
                    if (uVar27 <= uVar13) {
                      bVar20 = bVar8;
                    }
                    if (uVar13 < uVar14) {
                      bVar17 = bVar20;
                    }
                    if (uVar27 < uVar14) {
                      bVar17 = bVar20;
                    }
                    *psVar31 = bVar17 + raw[uVar16];
                    uVar16 = uVar16 + 1;
                    pbVar32 = pbVar32 + 1;
                    psVar31 = psVar31 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 5:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar31[uVar16] = (psVar6[uVar16 + (lVar24 - (int)uVar29)] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
                break;
              case 6:
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    psVar31[uVar16] = psVar6[uVar16 + (lVar24 - (int)uVar29)] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar9 != uVar16);
                }
              }
              raw = raw + (int)uVar9;
LAB_001133cd:
              if (lVar23 + 1U == uVar7) {
                if (7 < depth) goto joined_r0x0011343e;
                if (y != 0) {
                  uVar29 = x - 1;
                  lVar15 = uVar2 - uVar19;
                  lVar10 = (ulong)uVar29 + 1;
                  uVar18 = 0;
                  uVar16 = 0;
                  do {
                    bVar17 = 1;
                    if (color == 0) {
                      bVar17 = ""[depth];
                    }
                    psVar6 = a->out;
                    pbVar28 = psVar6 + uVar3 * (int)uVar16;
                    pbVar32 = pbVar28 + (uVar2 - uVar19);
                    uVar25 = (ulong)uVar18;
                    if (depth == 4) {
                      uVar9 = uVar5;
                      if (1 < (int)uVar5) {
                        psVar31 = psVar6 + lVar15;
                        uVar14 = uVar5;
                        do {
                          psVar6[uVar25] = (psVar31[uVar25] >> 4) * bVar17;
                          psVar6[uVar25 + 1] = (psVar31[uVar25] & 0xf) * bVar17;
                          uVar9 = uVar14 - 2;
                          psVar31 = psVar31 + 1;
                          psVar6 = psVar6 + 2;
                          bVar35 = 3 < uVar14;
                          uVar14 = uVar9;
                        } while (bVar35);
                        pbVar32 = psVar31 + uVar25;
                        pbVar28 = psVar6 + uVar25;
                      }
                      if (uVar9 == 1) {
                        *pbVar28 = (*pbVar32 >> 4) * bVar17;
                      }
                    }
                    else if (depth == 2) {
                      uVar9 = uVar5;
                      if (3 < (int)uVar5) {
                        psVar31 = psVar6 + lVar15;
                        uVar14 = uVar5;
                        do {
                          psVar6[uVar25] = (psVar31[uVar25] >> 6) * bVar17;
                          psVar6[uVar25 + 1] = (psVar31[uVar25] >> 4 & 3) * bVar17;
                          psVar6[uVar25 + 2] = (psVar31[uVar25] >> 2 & 3) * bVar17;
                          psVar6[uVar25 + 3] = (psVar31[uVar25] & 3) * bVar17;
                          uVar9 = uVar14 - 4;
                          psVar31 = psVar31 + 1;
                          psVar6 = psVar6 + 4;
                          bVar35 = 7 < uVar14;
                          uVar14 = uVar9;
                        } while (bVar35);
                        pbVar32 = psVar31 + uVar25;
                        pbVar28 = psVar6 + uVar25;
                      }
                      if (((0 < (int)uVar9) && (*pbVar28 = (*pbVar32 >> 6) * bVar17, uVar9 != 1)) &&
                         (pbVar28[1] = (*pbVar32 >> 4 & 3) * bVar17, uVar9 == 3)) {
                        pbVar28[2] = (*pbVar32 >> 2 & 3) * bVar17;
                      }
                    }
                    else if (depth == 1) {
                      uVar9 = uVar5;
                      if (7 < (int)uVar5) {
                        psVar31 = psVar6 + lVar15;
                        uVar14 = uVar5;
                        do {
                          psVar6[uVar25] = (char)psVar31[uVar25] >> 7 & bVar17;
                          psVar6[uVar25 + 1] = (char)(psVar31[uVar25] * '\x02') >> 7 & bVar17;
                          psVar6[uVar25 + 2] = (char)(psVar31[uVar25] << 2) >> 7 & bVar17;
                          psVar6[uVar25 + 3] = (char)(psVar31[uVar25] << 3) >> 7 & bVar17;
                          psVar6[uVar25 + 4] = (char)(psVar31[uVar25] << 4) >> 7 & bVar17;
                          psVar6[uVar25 + 5] = (char)(psVar31[uVar25] << 5) >> 7 & bVar17;
                          psVar6[uVar25 + 6] = (char)(psVar31[uVar25] << 6) >> 7 & bVar17;
                          bVar8 = bVar17;
                          if ((psVar31[uVar25] & 1) == 0) {
                            bVar8 = 0;
                          }
                          psVar6[uVar25 + 7] = bVar8;
                          uVar9 = uVar14 - 8;
                          psVar31 = psVar31 + 1;
                          psVar6 = psVar6 + 8;
                          bVar35 = 0xf < uVar14;
                          uVar14 = uVar9;
                        } while (bVar35);
                        pbVar32 = psVar31 + uVar25;
                        pbVar28 = psVar6 + uVar25;
                      }
                      if (((((0 < (int)uVar9) &&
                            (*pbVar28 = (char)*pbVar32 >> 7 & bVar17, uVar9 != 1)) &&
                           ((pbVar28[1] = (char)(*pbVar32 * '\x02') >> 7 & bVar17, 2 < uVar9 &&
                            ((pbVar28[2] = (char)(*pbVar32 << 2) >> 7 & bVar17, uVar9 != 3 &&
                             (pbVar28[3] = (char)(*pbVar32 << 3) >> 7 & bVar17, 4 < uVar9)))))) &&
                          (pbVar28[4] = (char)(*pbVar32 << 4) >> 7 & bVar17, uVar9 != 5)) &&
                         (pbVar28[5] = (char)(*pbVar32 << 5) >> 7 & bVar17, uVar9 == 7)) {
                        pbVar28[6] = (char)(*pbVar32 << 6) >> 7 & bVar17;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar6 = a->out;
                      if (a_00 == 1) {
                        lVar21 = lVar10;
                        if (-1 < (int)uVar29) {
                          do {
                            psVar6[lVar21 * 2 + (uVar25 - 1)] = 0xff;
                            psVar6[lVar21 * 2 + (uVar25 - 2)] = psVar6[lVar21 + (uVar25 - 1)];
                            lVar22 = lVar21 + -1;
                            bVar35 = 0 < lVar21;
                            lVar21 = lVar22;
                          } while (lVar22 != 0 && bVar35);
                        }
                      }
                      else {
                        if (a_00 != 3) {
                          __assert_fail("img_n == 3",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                                        ,0x11e6,
                                        "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                       );
                        }
                        if (-1 < (int)uVar29) {
                          psVar31 = psVar6 + (ulong)uVar29 * 3 + 2 + uVar25;
                          lVar21 = lVar10;
                          do {
                            psVar6[lVar21 * 4 + (uVar25 - 1)] = 0xff;
                            psVar6[lVar21 * 4 + (uVar25 - 2)] = *psVar31;
                            psVar6[lVar21 * 4 + (uVar25 - 3)] = psVar31[-1];
                            psVar6[lVar21 * 4 + (uVar25 - 4)] = psVar31[-2];
                            psVar31 = psVar31 + -3;
                            lVar22 = lVar21 + -1;
                            bVar35 = 0 < lVar21;
                            lVar21 = lVar22;
                          } while (lVar22 != 0 && bVar35);
                        }
                      }
                    }
                    uVar16 = uVar16 + 1;
                    uVar18 = uVar18 + uVar3;
                  } while (uVar16 != uVar7);
                  return 1;
                }
                goto LAB_00113851;
              }
            }
            else {
              if (a_00 + 1 != out_n) {
                __assert_fail("img_n+1 == out_n",
                              "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                              ,0x118d,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              switch(bVar17) {
              case 0:
                if (iVar4 != 0) {
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        psVar31[uVar25] = raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 1:
                if (iVar4 != 0) {
                  psVar6 = psVar6 + lVar24 + lVar22;
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        psVar31[uVar25] = psVar6[uVar25] + raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    psVar6 = psVar6 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 2:
                if (iVar4 != 0) {
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        psVar31[uVar25] = psVar31[uVar25 + lVar15] + raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 3:
                if (iVar4 != 0) {
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      psVar6 = psVar31;
                      do {
                        *psVar6 = (char)((uint)psVar6[lVar22] + (uint)psVar6[lVar15] >> 1) +
                                  raw[uVar25];
                        uVar25 = uVar25 + 1;
                        psVar6 = psVar6 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 4:
                if (iVar4 != 0) {
                  psVar12 = psVar6 + lVar24 + lVar15;
                  psVar26 = psVar6 + lVar24 + lVar22;
                  psVar6 = psVar6 + lVar24 + (lVar22 - (ulong)uVar3);
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        bVar17 = psVar26[uVar25];
                        bVar8 = psVar12[uVar25];
                        bVar20 = psVar6[uVar25];
                        iVar30 = ((uint)bVar8 + (uint)bVar17) - (uint)bVar20;
                        uVar14 = iVar30 - (uint)bVar17;
                        uVar9 = -uVar14;
                        if (0 < (int)uVar14) {
                          uVar9 = uVar14;
                        }
                        uVar27 = iVar30 - (uint)bVar8;
                        uVar14 = -uVar27;
                        if (0 < (int)uVar27) {
                          uVar14 = uVar27;
                        }
                        uVar13 = iVar30 - (uint)bVar20;
                        uVar27 = -uVar13;
                        if (0 < (int)uVar13) {
                          uVar27 = uVar13;
                        }
                        if (uVar14 <= uVar27) {
                          bVar20 = bVar8;
                        }
                        if (uVar27 < uVar9) {
                          bVar17 = bVar20;
                        }
                        if (uVar14 < uVar9) {
                          bVar17 = bVar20;
                        }
                        psVar31[uVar25] = bVar17 + raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    psVar12 = psVar12 + lVar21;
                    psVar26 = psVar26 + lVar21;
                    psVar6 = psVar6 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 5:
                if (iVar4 != 0) {
                  psVar6 = psVar6 + lVar24 + lVar22;
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        psVar31[uVar25] = (psVar6[uVar25] >> 1) + raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    psVar6 = psVar6 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                break;
              case 6:
                if (iVar4 != 0) {
                  psVar6 = psVar6 + lVar24 + lVar22;
                  iVar33 = iVar4;
                  do {
                    if (0 < (int)uVar29) {
                      uVar25 = 0;
                      do {
                        psVar31[uVar25] = psVar6[uVar25] + raw[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar29 != uVar25);
                    }
                    psVar31[(int)uVar29] = 0xff;
                    raw = raw + (int)uVar29;
                    psVar31 = psVar31 + lVar21;
                    psVar6 = psVar6 + lVar21;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
              }
              if (depth != 0x10) goto LAB_001133cd;
              if (x != 0) {
                psVar6 = a->out + (long)(int)uVar29 + uVar16 + 1;
                uVar16 = (ulong)x;
                do {
                  *psVar6 = 0xff;
                  psVar6 = psVar6 + lVar21;
                  uVar9 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar9;
                } while (uVar9 != 0);
                goto LAB_001133cd;
              }
              if (lVar23 + 1U == uVar7) goto LAB_00113440;
            }
            lVar23 = lVar23 + 1;
            uVar16 = (ulong)(uVar3 * (int)lVar23);
            psVar6 = a->out + uVar16;
            bVar17 = *raw;
          } while (bVar17 < 5);
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return local_dc;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }